

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_object.cpp
# Opt level: O0

global_object_create_result *
mjs::make_object_object
          (global_object_create_result *__return_storage_ptr__,
          gc_heap_ptr<mjs::global_object> *global)

{
  version vVar1;
  global_object *pgVar2;
  gc_heap_ptr<mjs::gc_string> *name;
  function_object *this;
  object *poVar3;
  anon_class_16_1_570cf4e1_for_f local_2a8;
  gc_heap_ptr<mjs::object> local_298;
  anon_class_16_1_570cf4e1_for_f local_288;
  gc_heap_ptr<mjs::object> local_278;
  anon_class_16_1_570cf4e1_for_f local_268;
  gc_heap_ptr<mjs::object> local_258;
  anon_class_16_1_570cf4e1_for_f local_248;
  gc_heap_ptr<mjs::object> local_238;
  anon_class_16_1_570cf4e1_for_f local_228;
  gc_heap_ptr<mjs::object> local_218;
  anon_class_16_1_570cf4e1_for_f local_208;
  gc_heap_ptr<mjs::object> local_1f8;
  anon_class_16_1_570cf4e1_for_f local_1e8;
  gc_heap_ptr<mjs::object> local_1d8;
  anon_class_16_1_570cf4e1_for_f local_1c8;
  gc_heap_ptr<mjs::object> local_1b8;
  anon_class_16_1_570cf4e1_for_f local_1a8;
  gc_heap_ptr<mjs::object> local_198;
  anon_class_16_1_570cf4e1_for_f local_188;
  gc_heap_ptr<mjs::object> local_178;
  anon_class_16_1_570cf4e1_for_f local_168;
  gc_heap_ptr<mjs::object> local_158;
  anon_class_16_1_570cf4e1_for_f local_148;
  gc_heap_ptr<mjs::object> local_138;
  anon_class_16_1_570cf4e1_for_f local_128;
  anon_class_16_1_570cf4e1_for_f local_118;
  gc_heap_ptr<mjs::object> local_108;
  anon_class_16_1_570cf4e1_for_f local_f8;
  anon_class_16_1_570cf4e1_for_f local_e8;
  anon_class_16_1_570cf4e1_for_f local_d8;
  anon_class_1_0_00000001_for_f local_c1;
  anon_class_8_1_54a39808_for_f local_c0;
  gc_heap *local_b8;
  gc_heap *h;
  value local_a0;
  string local_78;
  object local_68;
  anon_class_16_1_570cf4e1_for_f local_48;
  undefined1 local_38 [8];
  gc_heap_ptr<mjs::function_object> o;
  object_ptr prototype;
  gc_heap_ptr<mjs::global_object> *global_local;
  
  pgVar2 = gc_heap_ptr<mjs::global_object>::operator->(global);
  (*(pgVar2->super_object)._vptr_object[0xb])(&o.super_gc_heap_ptr_untyped.pos_);
  gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_48.global,global);
  gc_heap_ptr<mjs::object>::operator->
            ((gc_heap_ptr<mjs::object> *)&o.super_gc_heap_ptr_untyped.pos_);
  object::class_name(&local_68);
  name = string::unsafe_raw_get((string *)&local_68);
  make_function<mjs::make_object_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__0>
            ((mjs *)local_38,global,&local_48,name,1);
  string::~string((string *)&local_68);
  make_object_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_0::~__0((__0 *)&local_48);
  this = gc_heap_ptr<mjs::function_object>::operator->
                   ((gc_heap_ptr<mjs::function_object> *)local_38);
  function_object::default_construct_function(this);
  poVar3 = gc_heap_ptr<mjs::object>::operator->
                     ((gc_heap_ptr<mjs::object> *)&o.super_gc_heap_ptr_untyped.pos_);
  pgVar2 = gc_heap_ptr<mjs::global_object>::operator->(global);
  (*(pgVar2->super_object)._vptr_object[0x13])(&local_78,pgVar2,"constructor");
  gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::function_object,void>
            ((gc_heap_ptr<mjs::object> *)&h,(gc_heap_ptr<mjs::function_object> *)local_38);
  value::value(&local_a0,(object_ptr *)&h);
  (*poVar3->_vptr_object[1])(poVar3,&local_78,&local_a0,2);
  value::~value(&local_a0);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)&h);
  string::~string(&local_78);
  pgVar2 = gc_heap_ptr<mjs::global_object>::operator->(global);
  local_c0.h = object::heap(&pgVar2->super_object);
  local_b8 = local_c0.h;
  put_native_function<mjs::make_object_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__1>
            (global,(object_ptr *)&o.super_gc_heap_ptr_untyped.pos_,"toString",&local_c0,0);
  put_native_function<mjs::make_object_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__2>
            (global,(object_ptr *)&o.super_gc_heap_ptr_untyped.pos_,"valueOf",&local_c1,0);
  pgVar2 = gc_heap_ptr<mjs::global_object>::operator->(global);
  vVar1 = global_object::language_version(pgVar2);
  if (0 < (int)vVar1) {
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_d8.global,global);
    put_native_function<mjs::make_object_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__3>
              (global,(object_ptr *)&o.super_gc_heap_ptr_untyped.pos_,"toLocaleString",&local_d8,0);
    make_object_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_3::~__3((__3 *)&local_d8);
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_e8.global,global);
    put_native_function<mjs::make_object_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__4>
              (global,(object_ptr *)&o.super_gc_heap_ptr_untyped.pos_,"hasOwnProperty",&local_e8,1);
    make_object_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_4::~__4((__4 *)&local_e8);
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_f8.global,global);
    put_native_function<mjs::make_object_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__5>
              (global,(object_ptr *)&o.super_gc_heap_ptr_untyped.pos_,"propertyIsEnumerable",
               &local_f8,1);
    make_object_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_5::~__5((__5 *)&local_f8);
  }
  pgVar2 = gc_heap_ptr<mjs::global_object>::operator->(global);
  vVar1 = global_object::language_version(pgVar2);
  if (1 < (int)vVar1) {
    gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::function_object,void>
              (&local_108,(gc_heap_ptr<mjs::function_object> *)local_38);
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_118.global,global);
    put_native_function<mjs::make_object_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__6>
              (global,&local_108,"getPrototypeOf",&local_118,1);
    make_object_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_6::~__6((__6 *)&local_118);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_108);
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_128.global,global);
    put_native_function<mjs::make_object_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__7>
              (global,(object_ptr *)&o.super_gc_heap_ptr_untyped.pos_,"isPrototypeOf",&local_128,1);
    make_object_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_7::~__7((__7 *)&local_128);
    gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::function_object,void>
              (&local_138,(gc_heap_ptr<mjs::function_object> *)local_38);
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_148.global,global);
    put_native_function<mjs::make_object_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__8>
              (global,&local_138,"getOwnPropertyNames",&local_148,1);
    make_object_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_8::~__8((__8 *)&local_148);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_138);
    gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::function_object,void>
              (&local_158,(gc_heap_ptr<mjs::function_object> *)local_38);
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_168.global,global);
    put_native_function<mjs::make_object_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__9>
              (global,&local_158,"keys",&local_168,1);
    make_object_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_9::~__9((__9 *)&local_168);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_158);
    gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::function_object,void>
              (&local_178,(gc_heap_ptr<mjs::function_object> *)local_38);
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_188.global,global);
    put_native_function<mjs::make_object_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__10>
              (global,&local_178,"getOwnPropertyDescriptor",&local_188,2);
    make_object_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_10::~__10((__10 *)&local_188);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_178);
    gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::function_object,void>
              (&local_198,(gc_heap_ptr<mjs::function_object> *)local_38);
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_1a8.global,global);
    put_native_function<mjs::make_object_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__11>
              (global,&local_198,"defineProperty",&local_1a8,3);
    make_object_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_11::~__11((__11 *)&local_1a8);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_198);
    gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::function_object,void>
              (&local_1b8,(gc_heap_ptr<mjs::function_object> *)local_38);
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_1c8.global,global);
    put_native_function<mjs::make_object_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__12>
              (global,&local_1b8,"defineProperties",&local_1c8,2);
    make_object_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_12::~__12((__12 *)&local_1c8);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_1b8);
    gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::function_object,void>
              (&local_1d8,(gc_heap_ptr<mjs::function_object> *)local_38);
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_1e8.global,global);
    put_native_function<mjs::make_object_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__13>
              (global,&local_1d8,"isExtensible",&local_1e8,1);
    make_object_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_13::~__13((__13 *)&local_1e8);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_1d8);
    gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::function_object,void>
              (&local_1f8,(gc_heap_ptr<mjs::function_object> *)local_38);
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_208.global,global);
    put_native_function<mjs::make_object_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__14>
              (global,&local_1f8,"preventExtensions",&local_208,1);
    make_object_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_14::~__14((__14 *)&local_208);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_1f8);
    gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::function_object,void>
              (&local_218,(gc_heap_ptr<mjs::function_object> *)local_38);
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_228.global,global);
    put_native_function<mjs::make_object_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__15>
              (global,&local_218,"isSealed",&local_228,1);
    make_object_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_15::~__15((__15 *)&local_228);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_218);
    gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::function_object,void>
              (&local_238,(gc_heap_ptr<mjs::function_object> *)local_38);
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_248.global,global);
    put_native_function<mjs::make_object_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__16>
              (global,&local_238,"seal",&local_248,1);
    make_object_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_16::~__16((__16 *)&local_248);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_238);
    gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::function_object,void>
              (&local_258,(gc_heap_ptr<mjs::function_object> *)local_38);
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_268.global,global);
    put_native_function<mjs::make_object_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__17>
              (global,&local_258,"isFrozen",&local_268,1);
    make_object_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_17::~__17((__17 *)&local_268);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_258);
    gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::function_object,void>
              (&local_278,(gc_heap_ptr<mjs::function_object> *)local_38);
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_288.global,global);
    put_native_function<mjs::make_object_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__18>
              (global,&local_278,"freeze",&local_288,1);
    make_object_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_18::~__18((__18 *)&local_288);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_278);
    gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::function_object,void>
              (&local_298,(gc_heap_ptr<mjs::function_object> *)local_38);
    gc_heap_ptr<mjs::global_object>::gc_heap_ptr(&local_2a8.global,global);
    put_native_function<mjs::make_object_object(mjs::gc_heap_ptr<mjs::global_object>const&)::__19>
              (global,&local_298,"create",&local_2a8,2);
    make_object_object(mjs::gc_heap_ptr<mjs::global_object>const&)::$_19::~__19((__19 *)&local_2a8);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_298);
  }
  gc_heap_ptr<mjs::object>::gc_heap_ptr<mjs::function_object,void>
            (&__return_storage_ptr__->obj,(gc_heap_ptr<mjs::function_object> *)local_38);
  gc_heap_ptr<mjs::object>::gc_heap_ptr
            (&__return_storage_ptr__->prototype,
             (gc_heap_ptr<mjs::object> *)&o.super_gc_heap_ptr_untyped.pos_);
  gc_heap_ptr<mjs::function_object>::~gc_heap_ptr((gc_heap_ptr<mjs::function_object> *)local_38);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr
            ((gc_heap_ptr<mjs::object> *)&o.super_gc_heap_ptr_untyped.pos_);
  return __return_storage_ptr__;
}

Assistant:

global_object_create_result make_object_object(const gc_heap_ptr<global_object>& global) {
    auto prototype = global->object_prototype();
    auto o = make_function(global, [global](const value&, const std::vector<value>& args) {
        if (args.empty() || args.front().type() == value_type::undefined || args.front().type() == value_type::null) {
            return value{global->make_object()};
        }
        return value{global->to_object(args.front())};
    }, prototype->class_name().unsafe_raw_get(), 1);
    o->default_construct_function();

    // �15.2.4
    prototype->put(global->common_string("constructor"), value{o}, global_object::default_attributes);

    auto& h = global->heap();
    put_native_function(global, prototype, "toString", [&h](const value& this_, const std::vector<value>&){
        return value{string{h, "[object "} + this_.object_value()->class_name() + string{h, "]"}};
    }, 0);
    put_native_function(global, prototype, "valueOf", [](const value& this_, const std::vector<value>&){
        return this_;
    }, 0);

    if (global->language_version() >= version::es3) {
        put_native_function(global, prototype, "toLocaleString", [global](const value& this_, const std::vector<value>&) {
            auto o = global->to_object(this_);
            return call_function(o->get(L"toString"), value{o}, {});
        }, 0);
        put_native_function(global, prototype, "hasOwnProperty", [global](const value& this_, const std::vector<value>& args) {
            auto o = global->validate_object(this_);
            return value{has_own_property(o, to_string(o.heap(), get_arg(args, 0)).view())};
        }, 1);
        put_native_function(global, prototype, "propertyIsEnumerable", [global](const value& this_, const std::vector<value>& args) {
            auto o = global->validate_object(this_);
            const auto a = o->own_property_attributes(to_string(o.heap(), get_arg(args, 0)).view());
            return value{is_valid(a) && (a & property_attribute::dont_enum) == property_attribute::none};
        }, 1);
    }

    if (global->language_version() >= version::es5) {
        put_native_function(global, o, "getPrototypeOf", [global](const value&, const std::vector<value>& args) {
            auto o = global->validate_object(get_arg(args, 0));
            auto p = o->prototype();
            return p ? value{p} : value::null;
        }, 1);

        put_native_function(global, prototype, "isPrototypeOf", [global](const value& this_, const std::vector<value>& args) {
            if (!args.empty() && args[0].type() == value_type::object) {
                auto v = args[0].object_value()->prototype();
                auto o = global->to_object(this_);
                while (v) {
                    if (o.get() == v.get()) {
                        return value{true};
                    }
                    v = v->prototype();
                }
            }
            return value{false};
        }, 1);

        put_native_function(global, o, "getOwnPropertyNames", [global](const value&, const std::vector<value>& args) {
            return get_property_names(global, get_arg(args, 0), false);
        }, 1);

        put_native_function(global, o, "keys", [global](const value&, const std::vector<value>& args) {
            return get_property_names(global, get_arg(args, 0), true);
        }, 1);

        put_native_function(global, o, "getOwnPropertyDescriptor", [global](const value&, const std::vector<value>& args) {
            auto o = global->validate_object(get_arg(args, 0));
            auto& h = global->heap();
            auto p = to_string(h, get_arg(args, 1));
            const auto a = o->own_property_attributes(p.view());
            if (!is_valid(a)) {
                // Seems like we have to return undefined in ES5.1 (15.10.4)
                return value::undefined;
            }
            auto desc = global->make_object();
            if (has_attributes(a, property_attribute::accessor)) {
                copy_accessor_methods(desc, o->get_accessor_property_object(p.view()));
            } else {
                desc->put(global->common_string("value"), o->get(p.view()));
                desc->put(global->common_string("writable"), value{(a & property_attribute::read_only) == property_attribute::none});
            }
            desc->put(global->common_string("enumerable"), value{(a & property_attribute::dont_enum) == property_attribute::none});
            desc->put(global->common_string("configurable"), value{(a & property_attribute::dont_delete) == property_attribute::none});

            return value{desc};
        }, 2);

        put_native_function(global, o, "defineProperty", [global](const value&, const std::vector<value>& args) {
            auto& h = global->heap();
            auto o = global->validate_object(get_arg(args, 0));
            auto p = to_string(h, get_arg(args, 1));
            define_own_property_checked(global, o, p, get_arg(args, 2));
            return value{o};
        }, 3);

        put_native_function(global, o, "defineProperties", [global](const value&, const std::vector<value>& args) {
            auto o = global->validate_object(get_arg(args, 0));
            auto props = global->to_object(get_arg(args, 1));
            for (const auto& p : props->own_property_names(false)) {
                define_own_property_checked(global, o, p, props->get(p.view()));
            }
            return value{o};
        }, 2);

        put_native_function(global, o, "isExtensible", [global](const value&, const std::vector<value>& args) {
            return value{global->validate_object(get_arg(args, 0))->is_extensible()};
        }, 1);

        put_native_function(global, o, "preventExtensions", [global](const value&, const std::vector<value>& args) {
            auto o = global->validate_object(get_arg(args, 0));
            o->prevent_extensions();
            return value{o};
        }, 1);

        put_native_function(global, o, "isSealed", [global](const value&, const std::vector<value>& args) {
            return value{check_for_immutability(global->validate_object(get_arg(args, 0)), property_attribute::dont_delete)};
        }, 1);

        put_native_function(global, o, "seal", [global](const value&, const std::vector<value>& args) {
            auto o = global->validate_object(get_arg(args, 0));
            make_immutable(o, property_attribute::dont_delete);
            return value{o};
        }, 1);

        put_native_function(global, o, "isFrozen", [global](const value&, const std::vector<value>& args) {
            return value{check_for_immutability(global->validate_object(get_arg(args, 0)), property_attribute::read_only | property_attribute::dont_delete)};
        }, 1);

        put_native_function(global, o, "freeze", [global](const value&, const std::vector<value>& args) {
            auto o = global->validate_object(get_arg(args, 0));
            make_immutable(o, property_attribute::read_only | property_attribute::dont_delete);
            return value{o};
        }, 1);

        put_native_function(global, o, "create", [global](const value&, const std::vector<value>& args) {
            if (args.empty() || (args[0].type() != value_type::null && args[0].type() != value_type::object)) {
                throw native_error_exception{native_error_type::type, global->stack_trace(), L"Invalid object prototype"};
            }
            auto o = global->heap().make<object>(global->object_prototype()->class_name(), args[0].type() == value_type::object ? args[0].object_value() : nullptr);
            if (args.size() > 1) {
                auto props = global->to_object(args[1]);
                for (const auto& p : props->own_property_names(false)) {
                    define_own_property_checked(global, o, p, props->get(p.view()));
                }
            }
            return value{o};
        }, 2);
    }

    return { o, prototype };
}